

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O0

double __thiscall
duckdb::WindowQuantileState<int>::WindowScalar<double,false>
          (WindowQuantileState<int> *this,CursorType *data,SubFrames *frames,idx_t n,Vector *result,
          QuantileValue *q)

{
  int iVar1;
  bool bVar2;
  pointer this_00;
  reference pvVar3;
  reference pvVar4;
  size_type sVar5;
  string *msg;
  QuantileCursor<int> *in_RDI;
  IndexError *idx_err;
  array<int,_2UL> dest;
  Interpolator<false> interp;
  size_type in_stack_fffffffffffffed8;
  vector<std::pair<unsigned_long,_int>,_true> *in_stack_fffffffffffffee0;
  allocator *this_01;
  Vector *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  Interpolator<false> *in_stack_fffffffffffffef8;
  HeadNode<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_>
  *in_stack_ffffffffffffff00;
  QuantileValue *in_stack_ffffffffffffff28;
  Vector *in_stack_ffffffffffffff30;
  idx_t in_stack_ffffffffffffff38;
  SubFrames *in_stack_ffffffffffffff40;
  undefined6 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff56;
  allocator in_stack_ffffffffffffff57;
  string local_a8 [160];
  double local_8;
  
  bVar2 = ::std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>_>
                      *)0x1d5dbd9);
  if (bVar2) {
    unique_ptr<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>,_true>::
    operator->((unique_ptr<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>,_true>
                *)in_stack_fffffffffffffee0);
    local_8 = QuantileSortTree::WindowScalar<int,double,false>
                        ((QuantileSortTree *)
                         CONCAT17(in_stack_ffffffffffffff57,
                                  CONCAT16(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50)),
                         in_RDI,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                         in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  }
  else {
    bVar2 = ::std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_>_>_>
                        *)0x1d5dc35);
    if (!bVar2) {
      msg = (string *)__cxa_allocate_exception(0x10);
      this_01 = (allocator *)&stack0xffffffffffffff57;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_a8,"No accelerator for scalar QUANTILE",this_01);
      InternalException::InternalException((InternalException *)this_01,msg);
      __cxa_throw(msg,&InternalException::typeinfo,InternalException::~InternalException);
    }
    this_00 = unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_>_>,_true>
              ::operator->((unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_>_>,_true>
                            *)in_stack_fffffffffffffee0);
    duckdb_skiplistlib::skip_list::
    HeadNode<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_>::size
              (this_00);
    Interpolator<false>::Interpolator
              ((Interpolator<false> *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               (QuantileValue *)in_stack_fffffffffffffee8,(idx_t)in_stack_fffffffffffffee0,
               SUB81(in_stack_fffffffffffffed8 >> 0x38,0));
    unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_>_>,_true>
    ::operator->((unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_>_>,_true>
                  *)in_stack_fffffffffffffee0);
    duckdb_skiplistlib::skip_list::
    HeadNode<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_>::at
              (in_stack_ffffffffffffff00,(size_t)in_stack_fffffffffffffef8,
               CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               (vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
                *)in_stack_fffffffffffffee8);
    pvVar3 = vector<std::pair<unsigned_long,_int>,_true>::operator[]
                       (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    iVar1 = pvVar3->second;
    pvVar4 = ::std::array<int,_2UL>::operator[]
                       ((array<int,_2UL> *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    *pvVar4 = iVar1;
    sVar5 = ::std::
            vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>::
            size((vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
                  *)&(in_RDI->scan).current_chunk_state.handles._M_h._M_rehash_policy);
    if (sVar5 < 2) {
      in_stack_fffffffffffffef8 =
           (Interpolator<false> *)
           vector<std::pair<unsigned_long,_int>,_true>::operator[]
                     (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      in_stack_fffffffffffffef4 = *(int *)&in_stack_fffffffffffffef8->RN;
      pvVar4 = ::std::array<int,_2UL>::operator[]
                         ((array<int,_2UL> *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      *pvVar4 = in_stack_fffffffffffffef4;
    }
    else {
      pvVar3 = vector<std::pair<unsigned_long,_int>,_true>::operator[]
                         (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      iVar1 = pvVar3->second;
      pvVar4 = ::std::array<int,_2UL>::operator[]
                         ((array<int,_2UL> *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      *pvVar4 = iVar1;
    }
    ::std::array<int,_2UL>::data((array<int,_2UL> *)0x1d5de2e);
    local_8 = Interpolator<false>::Extract<int,double>
                        (in_stack_fffffffffffffef8,
                         (int *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                         in_stack_fffffffffffffee8);
  }
  return local_8;
}

Assistant:

RESULT_TYPE WindowScalar(CursorType &data, const SubFrames &frames, const idx_t n, Vector &result,
	                         const QuantileValue &q) const {
		D_ASSERT(n > 0);
		if (qst) {
			return qst->WindowScalar<INPUT_TYPE, RESULT_TYPE, DISCRETE>(data, frames, n, result, q);
		} else if (s) {
			// Find the position(s) needed
			try {
				Interpolator<DISCRETE> interp(q, s->size(), false);
				s->at(interp.FRN, interp.CRN - interp.FRN + 1, skips);
				array<INPUT_TYPE, 2> dest;
				dest[0] = skips[0].second;
				if (skips.size() > 1) {
					dest[1] = skips[1].second;
				} else {
					// Avoid UMA
					dest[1] = skips[0].second;
				}
				return interp.template Extract<INPUT_TYPE, RESULT_TYPE>(dest.data(), result);
			} catch (const duckdb_skiplistlib::skip_list::IndexError &idx_err) {
				throw InternalException(idx_err.message());
			}
		} else {
			throw InternalException("No accelerator for scalar QUANTILE");
		}
	}